

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

char * ByteToHex(uchar *vByte,int vLen)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  if (vByte == (uchar *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)operator_new__((long)((int)((long)vLen * 2) + 1));
    uVar4 = (ulong)(uint)vLen;
    if (vLen < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      bVar1 = vByte[uVar5];
      cVar2 = '7';
      if (bVar1 < 0xa0) {
        cVar2 = '0';
      }
      pcVar3[uVar5 * 2] = cVar2 + (bVar1 >> 4);
      cVar2 = '7';
      if ((bVar1 & 0xf) < 10) {
        cVar2 = '0';
      }
      pcVar3[uVar5 * 2 + 1] = cVar2 + (bVar1 & 0xf);
    }
    pcVar3[(long)vLen * 2] = '\0';
  }
  return pcVar3;
}

Assistant:

char* ByteToHex(const unsigned char* vByte, const int vLen)
{
	if (!vByte)
	{
		return NULL;
	}

	char* tmp = new char[vLen * 2 + 1];

	int tmp2;
	for (int i = 0; i < vLen; i++)
	{
		tmp2 = (int)(vByte[i]) / 16;
		tmp[i * 2] = (char)(tmp2 + ((tmp2 > 9) ? 'A' - 10 : '0'));
		tmp2 = (int)(vByte[i]) % 16;
		tmp[i * 2 + 1] = (char)(tmp2 + ((tmp2 > 9) ? 'A' - 10 : '0'));
	}

	tmp[vLen * 2] = '\0';
	return tmp;
}